

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O0

void __thiscall rengine::OpenGLRenderer::build(OpenGLRenderer *this,Node *n)

{
  vec2 vVar1;
  mat4 o;
  vec3 v_00;
  undefined8 this_00;
  bool bVar2;
  Type TVar3;
  uint uVar4;
  Texture *pTVar5;
  byte bVar6;
  Element *pEVar7;
  mat4 *this_01;
  float fVar8;
  float fVar9;
  vec4 vVar10;
  rect2d rVar11;
  vec3 vVar12;
  uint local_450;
  bool local_442;
  bool local_441;
  mat4 *local_438;
  Node *local_408;
  Node *c_2;
  vec2 local_3e0;
  vec2 local_3d8;
  vec2 local_3d0;
  vec2 local_3c8;
  vec3 local_3c0;
  undefined8 local_3b4;
  float local_3ac;
  vec2 local_3a8;
  vec2 p2_1;
  vec2 p1_1;
  rect2d geometry_1;
  Element *e_3;
  uint i_1;
  float z;
  vec2 local_364;
  vec2 local_35c;
  vec2 local_354;
  vec2 local_34c;
  vec2 local_344;
  vec2 local_33c;
  vec2 local_334;
  vec2 local_32c;
  vec2 local_324;
  vec2 local_31c;
  vec2 local_314;
  vec2 local_30c;
  vec2 local_304;
  vec2 local_2fc;
  vec2 local_2f4;
  vec2 local_2ec;
  vec2 brr;
  float local_2dc;
  float fStack_2d8;
  vec2 tlr;
  float b1;
  float t1;
  float radius;
  vec2 local_2c0;
  vec2 *local_2b8;
  vec2 *v_1;
  rect2d box;
  Node *c_1;
  vec2 local_28c;
  float local_284;
  undefined1 auStack_280 [4];
  float inf;
  rect2d storedBox;
  Element *e_2;
  bool storedTextureed;
  float fStack_254;
  mat4 local_250;
  bool local_209;
  Node *pNStack_208;
  bool useTexture;
  Node *c;
  float afStack_1f8 [2];
  float local_1f0 [2];
  float afStack_1e8 [2];
  float local_1e0 [2];
  float afStack_1d8 [2];
  float local_1d0 [2];
  float afStack_1c8 [2];
  uint local_1c0;
  mat4 local_1b8;
  undefined1 local_174 [8];
  mat4 old;
  mat4 *m;
  Element *e_1;
  TransformNode *tn;
  int local_10c;
  int i;
  vec2 local_f8;
  vec2 local_f0;
  vec2 local_e8;
  vec2 local_e0;
  vec2 local_d8;
  vec2 local_d0;
  vec2 *local_c8;
  vec2 local_c0;
  undefined8 local_b8;
  float local_b0;
  vec3 local_a8;
  vec2 local_98;
  vec2 local_90;
  vec2 local_84;
  vec2 local_7c;
  vec3 local_74;
  undefined8 local_68;
  float local_60;
  vec2 *local_58;
  vec2 *v;
  vec2 p2;
  vec2 p1;
  Element *e;
  float fStack_2c;
  undefined1 local_28 [8];
  rect2d geometry;
  Node *n_local;
  OpenGLRenderer *this_local;
  
  geometry.br = (vec2)n;
  TVar3 = Node::type(n);
  vVar1 = geometry.br;
  switch(TVar3) {
  case TransformNodeType:
    m = (mat4 *)0x0;
    fVar8 = TransformNode::projectionDepth((TransformNode *)geometry.br);
    if (((fVar8 != 0.0) || (NAN(fVar8))) && ((this->field_0x1f8 & 1) == 0)) {
      this->field_0x1f8 = this->field_0x1f8 & 0xfe | 1;
      fVar8 = TransformNode::projectionDepth((TransformNode *)vVar1);
      this->m_farPlane = fVar8;
      uVar4 = this->m_elementIndex;
      this->m_elementIndex = uVar4 + 1;
      m = (mat4 *)(this->m_elements + uVar4);
      *(vec2 *)m->m = geometry.br;
      *(float *)((long)m->m + 0xc) = 0.0;
      *(uint *)((long)m->m + 0x18) = *(uint *)((long)m->m + 0x18) & 0xdfffffff | 0x20000000;
    }
    if ((this->field_0x1f8 & 1) == 0) {
      local_438 = &this->m_m2d;
    }
    else {
      local_438 = &this->m_m3d;
    }
    old._60_8_ = local_438;
    memcpy(local_174,local_438,0x44);
    this_00 = old._60_8_;
    TransformNode::matrix((mat4 *)&c,(TransformNode *)vVar1);
    o.m[2] = afStack_1f8[0];
    o.m[3] = afStack_1f8[1];
    o.m._0_8_ = c;
    o.m[4] = local_1f0[0];
    o.m[5] = local_1f0[1];
    o.m[6] = afStack_1e8[0];
    o.m[7] = afStack_1e8[1];
    o.m[8] = local_1e0[0];
    o.m[9] = local_1e0[1];
    o.m[10] = afStack_1d8[0];
    o.m[0xb] = afStack_1d8[1];
    o.m[0xc] = local_1d0[0];
    o.m[0xd] = local_1d0[1];
    o.m[0xe] = afStack_1c8[0];
    o.m[0xf] = afStack_1c8[1];
    o.type = local_1c0;
    mat4::operator*(&local_1b8,(mat4 *)this_00,o);
    memcpy((void *)old._60_8_,&local_1b8,0x44);
    for (pNStack_208 = Node::child((Node *)geometry.br); pNStack_208 != (Node *)0x0;
        pNStack_208 = Node::sibling(pNStack_208)) {
      build(this,pNStack_208);
    }
    memcpy((void *)old._60_8_,local_174,0x44);
    if (m == (mat4 *)0x0) {
      return;
    }
    this->field_0x1f8 = this->field_0x1f8 & 0xfe;
    this->m_farPlane = 0.0;
    m->m[6] = (float)((uint)m->m[6] & 0xe0000000 |
                     (int)((long)((long)this->m_elements +
                                 ((ulong)this->m_elementIndex * 0x20 - (long)m)) >> 5) - 1U &
                     0x1fffffff);
    return;
  case OpacityNodeType:
  case ColorFilterNodeType:
  case BlurNodeType:
  case ShadowNodeType:
    TVar3 = Node::type((Node *)geometry.br);
    if (TVar3 == OpacityNodeType) {
      fVar8 = OpacityNode::opacity((OpacityNode *)geometry.br);
      local_441 = true;
      if (fVar8 < 1.0) goto LAB_0012db4c;
    }
    TVar3 = Node::type((Node *)geometry.br);
    if (TVar3 == ColorFilterNodeType) {
      ColorFilterNode::colorMatrix(&local_250,(ColorFilterNode *)geometry.br);
      bVar2 = mat4::isIdentity(&local_250);
      local_441 = true;
      if (!bVar2) goto LAB_0012db4c;
    }
    TVar3 = Node::type((Node *)geometry.br);
    if (TVar3 == BlurNodeType) {
      uVar4 = BlurNode::radius((BlurNode *)geometry.br);
      local_441 = true;
      if (uVar4 != 0) goto LAB_0012db4c;
    }
    TVar3 = Node::type((Node *)geometry.br);
    local_442 = false;
    if (TVar3 == ShadowNodeType) {
      vVar10 = ShadowNode::color((ShadowNode *)geometry.br);
      fStack_254 = vVar10.w;
      local_442 = 0.0 < fStack_254;
    }
    local_441 = local_442;
LAB_0012db4c:
    local_209 = local_441;
    bVar6 = (byte)this->field_0x1f8 >> 1 & 1;
    storedBox.br.x = 0.0;
    storedBox.br.y = 0.0;
    _auStack_280 = (this->m_layerBoundingBox).tl;
    storedBox.tl = (this->m_layerBoundingBox).br;
    if (local_441 != false) {
      this->field_0x1f8 = this->field_0x1f8 & 0xfd | 2;
      uVar4 = this->m_elementIndex;
      this->m_elementIndex = uVar4 + 1;
      storedBox.br = (vec2)(this->m_elements + uVar4);
      *(vec2 *)storedBox.br = geometry.br;
      *(uint *)((long)storedBox.br + 0x18) =
           *(uint *)((long)storedBox.br + 0x18) & 0xdfffffff | (uint)(this->field_0x1f8 & 1) << 0x1d
      ;
      *(uint *)((long)storedBox.br + 0x18) =
           *(uint *)((long)storedBox.br + 0x18) & 0xbfffffff | 0x40000000;
      local_284 = std::numeric_limits<float>::infinity();
      rect2d::rect2d((rect2d *)((long)&c_1 + 4),INFINITY,INFINITY,-INFINITY,-INFINITY);
      (this->m_layerBoundingBox).tl = stack0xfffffffffffffd6c;
      (this->m_layerBoundingBox).br = local_28c;
    }
    for (box.br = (vec2)Node::child((Node *)geometry.br); box.br != (vec2)0x0;
        box.br = (vec2)Node::sibling((Node *)box.br)) {
      build(this,(Node *)box.br);
    }
    if (storedBox.br == (vec2)0x0) {
      return;
    }
    this->field_0x1f8 = this->field_0x1f8 & 0xfd | bVar6 * '\x02';
    *(uint *)((long)storedBox.br + 0x18) =
         *(uint *)((long)storedBox.br + 0x18) & 0xe0000000 |
         (int)((long)this->m_elements + ((ulong)this->m_elementIndex * 0x20 - (long)storedBox.br) >>
              5) - 1U & 0x1fffffff;
    *(uint *)((long)storedBox.br + 8) = this->m_vertexIndex;
    rVar11 = rect2d::aligned(&this->m_layerBoundingBox);
    v_1 = (vec2 *)rVar11.tl;
    box.tl = rVar11.br;
    local_2b8 = this->m_vertices + this->m_vertexIndex;
    *local_2b8 = (vec2)v_1;
    fVar8 = rect2d::left((rect2d *)&v_1);
    fVar9 = rect2d::bottom((rect2d *)&v_1);
    vec2::vec2(&local_2c0,fVar8,fVar9);
    local_2b8[1] = local_2c0;
    fVar8 = rect2d::right((rect2d *)&v_1);
    fVar9 = rect2d::top((rect2d *)&v_1);
    vec2::vec2((vec2 *)&t1,fVar8,fVar9);
    local_2b8[2] = _t1;
    local_2b8[3] = box.tl;
    this->m_vertexIndex = this->m_vertexIndex + 4;
    TVar3 = Node::type((Node *)geometry.br);
    if ((TVar3 == BlurNodeType) ||
       (TVar3 = Node::type((Node *)geometry.br), TVar3 == ShadowNodeType)) {
      TVar3 = Node::type((Node *)geometry.br);
      if (TVar3 == BlurNodeType) {
        local_450 = BlurNode::radius((BlurNode *)geometry.br);
      }
      else {
        local_450 = ShadowNode::radius((ShadowNode *)geometry.br);
      }
      fVar8 = v_1._4_4_ - 1.0;
      fVar9 = box.tl.y + 1.0;
      vec2::vec2(&brr,(float)local_450);
      vVar1 = vec2::operator-((vec2 *)&v_1,brr);
      vec2::vec2(&local_2f4,(float)local_450);
      local_2ec = vec2::operator+(&box.tl,local_2f4);
      local_2dc = vVar1.x;
      vec2::vec2(&local_2fc,local_2dc,fVar8);
      local_2b8[4] = local_2fc;
      vec2::vec2(&local_304,local_2dc,fVar9);
      local_2b8[5] = local_304;
      vec2::vec2(&local_30c,local_2ec.x,fVar8);
      local_2b8[6] = local_30c;
      vec2::vec2(&local_314,local_2ec.x,fVar9);
      local_2b8[7] = local_314;
      fStack_2d8 = vVar1.y;
      vec2::vec2(&local_31c,local_2dc,fStack_2d8);
      local_2b8[8] = local_31c;
      vec2::vec2(&local_324,local_2dc,local_2ec.y);
      local_2b8[9] = local_324;
      vec2::vec2(&local_32c,local_2ec.x,fStack_2d8);
      local_2b8[10] = local_32c;
      vec2::vec2(&local_334,local_2ec.x,local_2ec.y);
      local_2b8[0xb] = local_334;
      this->m_vertexIndex = this->m_vertexIndex + 8;
      TVar3 = Node::type((Node *)geometry.br);
      if (TVar3 == ShadowNodeType) {
        vec2::vec2(&local_344,1.0);
        local_33c = vec2::operator-((vec2 *)&v_1,local_344);
        local_2b8[0xc] = local_33c;
        fVar8 = rect2d::left((rect2d *)&v_1);
        fVar9 = rect2d::bottom((rect2d *)&v_1);
        vec2::vec2(&local_34c,fVar8 - 1.0,fVar9 + 1.0);
        local_2b8[0xd] = local_34c;
        fVar8 = rect2d::right((rect2d *)&v_1);
        fVar9 = rect2d::top((rect2d *)&v_1);
        vec2::vec2(&local_354,fVar8 + 1.0,fVar9 - 1.0);
        local_2b8[0xe] = local_354;
        vec2::vec2(&local_364,1.0);
        local_35c = vec2::operator+(&box.tl,local_364);
        local_2b8[0xf] = local_35c;
      }
    }
    if (bVar6 != 0) {
      rect2d::operator|=((rect2d *)auStack_280,this->m_layerBoundingBox);
    }
    (this->m_layerBoundingBox).tl = _auStack_280;
    (this->m_layerBoundingBox).br = storedBox.tl;
    if ((this->field_0x1f8 & 1) == 0) {
      return;
    }
    e_3._4_4_ = 0.0;
    for (e_3._0_4_ = 0; (uint)e_3 <= (*(uint *)((long)storedBox.br + 0x18) & 0x1fffffff);
        e_3._0_4_ = (uint)e_3 + 1) {
      e_3._4_4_ = *(float *)((long)storedBox.br + (ulong)(uint)e_3 * 0x20 + 0xc) + e_3._4_4_;
    }
    *(float *)((long)storedBox.br + 0xc) =
         e_3._4_4_ / (float)(*(uint *)((long)storedBox.br + 0x18) & 0x1fffffff);
    return;
  default:
    break;
  case RectangleNodeType:
  case TextureNodeType:
    rVar11 = RectangleNodeBase::geometry((RectangleNodeBase *)geometry.br);
    local_28 = (undefined1  [8])rVar11.tl;
    geometry.tl = rVar11.br;
    fVar8 = rect2d::width((rect2d *)local_28);
    bVar2 = true;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      fVar8 = rect2d::height((rect2d *)local_28);
      bVar2 = true;
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        TVar3 = Node::type((Node *)geometry.br);
        if (TVar3 == TextureNodeType) {
          pTVar5 = TextureNode::texture((TextureNode *)geometry.br);
          bVar2 = true;
          if (pTVar5 == (Texture *)0x0) goto LAB_0012d4bf;
        }
        TVar3 = Node::type((Node *)geometry.br);
        bVar2 = false;
        if (TVar3 == RectangleNodeType) {
          vVar10 = RectangleNode::color((RectangleNode *)geometry.br);
          fStack_2c = vVar10.w;
          bVar2 = fStack_2c < 0.001;
        }
      }
    }
LAB_0012d4bf:
    if (!bVar2) {
      pEVar7 = this->m_elements + this->m_elementIndex;
      pEVar7->node = (Node *)geometry.br;
      pEVar7->vboOffset = this->m_vertexIndex;
      p2.x = (float)local_28._0_4_;
      p2.y = (float)local_28._4_4_;
      v = (vec2 *)geometry.tl;
      local_58 = this->m_vertices + this->m_vertexIndex;
      if ((this->field_0x1f8 & 1) == 0) {
        this_01 = &this->m_m2d;
        local_d8.x = (float)local_28._0_4_;
        local_d8.y = (float)local_28._4_4_;
        local_d0 = mat4::operator*(this_01,(vec2)local_28);
        *local_58 = local_d0;
        vec2::vec2(&local_e8,p2.x,v._4_4_);
        local_e0 = mat4::operator*(this_01,local_e8);
        local_58[1] = local_e0;
        vec2::vec2(&local_f8,v._0_4_,p2.y);
        local_f0 = mat4::operator*(this_01,local_f8);
        local_58[2] = local_f0;
        vVar1 = mat4::operator*(this_01,(vec2)v);
        local_58[3] = vVar1;
      }
      else {
        local_90 = geometry.tl;
        local_84 = vec2::operator+(&p2,geometry.tl);
        vec2::vec2(&local_98,2.0);
        local_7c = vec2::operator/(&local_84,local_98);
        vec3::vec3(&local_74,local_7c,0.0);
        local_a8.z = local_74.z;
        local_a8.x = local_74.x;
        local_a8.y = local_74.y;
        v_00.z = local_74.z;
        v_00.x = local_74.x;
        v_00.y = local_74.y;
        vVar12 = mat4::operator*(&this->m_m3d,v_00);
        local_b0 = vVar12.z;
        local_b8 = vVar12._0_8_;
        pEVar7->z = local_b0;
        local_c0 = p2;
        local_c8 = v;
        local_68 = local_b8;
        local_60 = local_b0;
        projectQuad(this,p2,(vec2)v,local_58);
      }
      this->m_vertexIndex = this->m_vertexIndex + 4;
      this->m_elementIndex = this->m_elementIndex + 1;
      if (((byte)this->field_0x1f8 >> 1 & 1) != 0) {
        for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
          rect2d::operator|=(&this->m_layerBoundingBox,local_58[local_10c]);
        }
      }
    }
    break;
  case RenderNodeType:
    pEVar7 = this->m_elements;
    uVar4 = this->m_elementIndex;
    this->m_elementIndex = uVar4 + 1;
    pEVar7[uVar4].node = (Node *)geometry.br;
    rVar11 = RectangleNodeBase::geometry((RectangleNodeBase *)geometry.br);
    p2_1 = rVar11.tl;
    local_3a8 = rVar11.br;
    if ((this->field_0x1f8 & 1) != 0) {
      local_3d8 = local_3a8;
      local_3d0 = vec2::operator+(&p2_1,local_3a8);
      vec2::vec2(&local_3e0,2.0);
      local_3c8 = vec2::operator/(&local_3d0,local_3e0);
      vec3::vec3(&local_3c0,local_3c8,0.0);
      vVar12.z = local_3c0.z;
      vVar12.x = local_3c0.x;
      vVar12.y = local_3c0.y;
      vVar12 = mat4::operator*(&this->m_m3d,vVar12);
      local_3ac = vVar12.z;
      local_3b4 = vVar12._0_8_;
      pEVar7[uVar4].z = local_3ac;
    }
  }
  for (local_408 = Node::child((Node *)geometry.br); local_408 != (Node *)0x0;
      local_408 = Node::sibling(local_408)) {
    build(this,local_408);
  }
  return;
}

Assistant:

inline void OpenGLRenderer::build(Node *n)
{
    switch (n->type()) {
    case Node::TextureNodeType:
    case Node::RectangleNodeType: {
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();

        // Skip if empty..
        if (geometry.width() == 0 || geometry.height() == 0
            || (n->type() == Node::TextureNodeType && static_cast<TextureNode *>(n)->texture() == 0)
            || (n->type() == Node::RectangleNodeType && static_cast<RectangleNode *>(n)->color().w < RENGINE_RENDERER_ALPHA_THRESHOLD))
            break;

        Element *e = m_elements + m_elementIndex;
        e->node = n;
        e->vboOffset = m_vertexIndex;
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        vec2 *v = m_vertices + m_vertexIndex;

        // std::cout << " -- building rect from " << p1 << " " << p2 << " into " << m_vertices << " " << e << std::endl;

        if (m_render3d) {
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
            projectQuad(p1, p2, v);

        } else {
            v[0] = m_m2d * p1;
            v[1] = m_m2d * vec2(p1.x, p2.y);
            v[2] = m_m2d * vec2(p2.x, p1.y);
            v[3] = m_m2d * p2;
        }
        m_vertexIndex += 4;
        m_elementIndex += 1;

        // Add to the bounding box if we're in inside a layer
        if (m_layered) {
            for (int i=0; i<4; ++i)
                m_layerBoundingBox |= v[i];
            // std::cout << " ----> bounds: " << m_layerBoundingBox << std::endl;
        }

    } break;

    case Node::TransformNodeType: {
        TransformNode *tn = static_cast<TransformNode *>(n);

        Element *e = 0;

        if (tn->projectionDepth() && !m_render3d) {
            m_render3d = true;
            m_farPlane = tn->projectionDepth();
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->z = 0;
            e->projection = true;
        }

        mat4 *m = m_render3d ? &m_m3d : &m_m2d;
        mat4 old = *m;
        *m = *m * tn->matrix();

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        // restore previous state
        *m = old;
        if (e) {
            m_render3d = false;
            m_farPlane = 0;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
        }
    } return;

    // all layered node types take this code path
    case Node::ShadowNodeType:
    case Node::BlurNodeType:
    case Node::ColorFilterNodeType:
    case Node::OpacityNodeType: {

        bool useTexture =
            (n->type() == Node::OpacityNodeType && static_cast<OpacityNode *>(n)->opacity() < 1.0f)
            || (n->type() == Node::ColorFilterNodeType && !static_cast<ColorFilterNode *>(n)->colorMatrix().isIdentity())
            || (n->type() == Node::BlurNodeType && static_cast<BlurNode *>(n)->radius() > 0)
            || (n->type() == Node::ShadowNodeType && static_cast<ShadowNode *>(n)->color().w > 0);

        bool storedTextureed = m_layered;
        Element *e = 0;
        rect2d storedBox = m_layerBoundingBox;

        if (useTexture) {
            m_layered = true;
            e = m_elements + m_elementIndex++;
            e->node = n;
            e->projection = m_render3d;
            e->layered = true;
            const float inf = std::numeric_limits<float>::infinity();
            m_layerBoundingBox = rect2d(inf, inf, -inf, -inf);
        }
        // std::cout << " -- building layered node into " << e << std::endl;

        for (Node *c = n->child(); c; c = c->sibling())
            build(c);

        if (e) {
            m_layered = storedTextureed;
            e->groupSize = (m_elements + m_elementIndex) - e - 1;
            // std::cout << "groupSize of " << e << " is " << e->groupSize << " based on: " << m_elements << " " << m_elementIndex << " " << e << std::endl;
            e->vboOffset = m_vertexIndex;
            rect2d box = m_layerBoundingBox.aligned();
            vec2 *v = m_vertices + m_vertexIndex;
            v[0] = box.tl;
            v[1] = vec2(box.left(), box.bottom());
            v[2] = vec2(box.right(), box.top());
            v[3] = box.br;
            m_vertexIndex += 4;

            if (n->type() == Node::BlurNodeType || n->type() == Node::ShadowNodeType) {
                float radius = n->type() == Node::BlurNodeType
                               ? static_cast<BlurNode *>(n)->radius()
                               : static_cast<ShadowNode *>(n)->radius();
                float t1 = box.tl.y - 1;
                float b1 = box.br.y + 1;
                vec2 tlr = box.tl - vec2(radius);
                vec2 brr = box.br + vec2(radius);
                v[ 4] = vec2(tlr.x, t1);
                v[ 5] = vec2(tlr.x, b1);
                v[ 6] = vec2(brr.x, t1);
                v[ 7] = vec2(brr.x, b1);
                v[ 8] = vec2(tlr.x, tlr.y);
                v[ 9] = vec2(tlr.x, brr.y);
                v[10] = vec2(brr.x, tlr.y);
                v[11] = vec2(brr.x, brr.y);
                m_vertexIndex += 8;

                if (n->type() == Node::ShadowNodeType) {
                    v[12] = box.tl - 1.0;
                    v[13] = vec2(box.left() - 1, box.bottom() + 1);
                    v[14] = vec2(box.right() + 1, box.top() - 1);
                    v[15] = box.br + 1;
                }
            }

            // We're a nested layer, accumulate the layered bounding box into
            // the stored one..
            if (storedTextureed)
                storedBox |= m_layerBoundingBox;

            m_layerBoundingBox = storedBox;
            if (m_render3d) {
                // Let the opacity layer's z be the average of all its children..
                float z = 0;
                for (unsigned i=0; i<=e->groupSize; ++i)
                    z += (e+i)->z;
                e->z = z / e->groupSize;
            }
        }

    } return;

    case Node::RenderNodeType: {
        Element *e = m_elements + m_elementIndex++;
        e->node = n;
        rect2d geometry = static_cast<RectangleNodeBase *>(n)->geometry();
        vec2 p1 = geometry.tl;
        vec2 p2 = geometry.br;
        // This will "kinda" work. As long as our 3d support is based on back-
        // to-front ordering of the center of primitives, we might as well
        // order render nodes back-to-front as well. The usercase is a bit
        // broken though..
        if (m_render3d)
            e->z = (m_m3d * vec3((p1 + p2) / 2.0f)).z;
        break;
    }

    default:
        break;
    }

    for (Node *c = n->child(); c; c = c->sibling())
        build(c);


}